

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.h
# Opt level: O0

void __thiscall TransArray::add(TransArray *this,int fd,int item,int use_seq,int pos,int custid)

{
  int iVar1;
  reference pvVar2;
  int custid_local;
  int pos_local;
  int use_seq_local;
  int item_local;
  int fd_local;
  TransArray *this_local;
  
  if (use_seq == 0) {
    if (this->totSize < (long)(this->theSize + 1)) {
      flushbuf(this,fd,0,pos);
    }
  }
  else {
    if (this->totSize < (long)(this->theSize + 2)) {
      flushbuf(this,fd,use_seq,pos);
    }
    iVar1 = this->theSize;
    this->theSize = iVar1 + 1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->theArray,(long)iVar1);
    *pvVar2 = custid;
  }
  iVar1 = this->theSize;
  this->theSize = iVar1 + 1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->theArray,(long)iVar1);
  *pvVar2 = item;
  return;
}

Assistant:

void add(int fd, int item, int use_seq, int pos, int custid = -1) {
        if (use_seq) {
            if (theSize + 2 > totSize) {
                flushbuf(fd, use_seq, pos);
            }
            theArray[theSize++] = custid;
        } else {
            if (theSize + 1 > totSize) {
                flushbuf(fd, use_seq, pos);
            }
        }
        theArray[theSize++] = item;
    }